

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

bool __thiscall tcmalloc::TestingPortalImpl::HaveSystemRelease(TestingPortalImpl *this)

{
  int iVar1;
  anon_class_1_0_00000001 local_11;
  
  if (HaveSystemRelease()::have == '\0') {
    iVar1 = __cxa_guard_acquire(&HaveSystemRelease()::have);
    if (iVar1 != 0) {
      HaveSystemRelease::have = HaveSystemRelease::anon_class_1_0_00000001::operator()(&local_11);
      __cxa_guard_release(&HaveSystemRelease()::have);
    }
  }
  return HaveSystemRelease::have;
}

Assistant:

bool HaveSystemRelease() override {
    static bool have = ([] () {
      size_t actual;
      auto ptr = TCMalloc_SystemAlloc(kPageSize, &actual, 0);
      return TCMalloc_SystemRelease(ptr, actual);
    })();
    return have;
  }